

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall testing::Matcher<void_*>::Matcher(Matcher<void_*> *this,void *value)

{
  linked_ptr<const_testing::MatcherInterface<void_*>_> local_30;
  
  (this->super_MatcherBase<void_*>).impl_.value_ = (MatcherInterface<void_*> *)0x0;
  (this->super_MatcherBase<void_*>).impl_.link_.next_ =
       &(this->super_MatcherBase<void_*>).impl_.link_;
  (this->super_MatcherBase<void_*>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00167968;
  local_30.value_ = (MatcherInterface<void_*> *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_00167e38;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)value;
  local_30.link_.next_ = &local_30.link_;
  internal::linked_ptr<const_testing::MatcherInterface<void_*>_>::operator=
            (&(this->super_MatcherBase<void_*>).impl_,&local_30);
  internal::linked_ptr<const_testing::MatcherInterface<void_*>_>::~linked_ptr(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }